

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O2

bool __thiscall
ChainstateManager::AcceptBlockHeader
          (ChainstateManager *this,CBlockHeader *block,BlockValidationState *state,
          CBlockIndex **ppindex,bool min_pow_checked)

{
  uint256 *this_00;
  BlockMap *this_01;
  long lVar1;
  CBlockIndex *pCVar2;
  bool bVar3;
  iterator iVar4;
  CBlockIndex *pCVar5;
  _Rb_tree_node_base *p_Var6;
  int source_line;
  undefined7 in_register_00000081;
  CBlockIndex *args_1;
  CBlockIndex *pCVar7;
  Level level;
  LogFlags flag;
  long in_FS_OFFSET;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  string_view source_file_02;
  string_view source_file_03;
  string_view source_file_04;
  string_view source_file_05;
  string_view source_file_06;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view logging_function_02;
  string_view logging_function_03;
  string_view logging_function_04;
  string_view logging_function_05;
  string_view logging_function_06;
  allocator<char> local_a9;
  CBlockIndex *local_a8;
  allocator<char> local_99;
  string local_98;
  string msg;
  uint256 hash;
  
  args_1 = (CBlockIndex *)CONCAT71(in_register_00000081,min_pow_checked);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CBlockHeader::GetHash((uint256 *)&hash.super_base_blob<256U>,block);
  this_01 = &(this->m_blockman).m_block_index;
  iVar4 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&this_01->_M_h,(key_type *)&hash.super_base_blob<256U>);
  bVar3 = ::operator!=(&hash.super_base_blob<256U>,(base_blob<256U> *)(this->m_options).chainparams)
  ;
  if (bVar3) {
    if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur ==
        (__node_type *)0x0) {
      bVar3 = CheckBlockHeader(block,state,&((this->m_options).chainparams)->consensus,true);
      if (bVar3) {
        this_00 = &block->hashPrevBlock;
        iVar4 = std::
                _Hashtable<uint256,_std::pair<const_uint256,_CBlockIndex>,_std::allocator<std::pair<const_uint256,_CBlockIndex>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_BlockHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find(&this_01->_M_h,this_00);
        if (iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>._M_cur ==
            (__node_type *)0x0) {
          bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
          if (bVar3) {
            base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
            base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)this_00);
            source_file_02._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_02._M_len = 0x5e;
            logging_function_02._M_str = "AcceptBlockHeader";
            logging_function_02._M_len = 0x11;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_02,source_file_02,0x10c9,VALIDATION,Debug,
                       (ConstevalFormatString<2U>)0xcd2354,&msg,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&msg);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"prev-blk-not-found",(allocator<char> *)&local_a8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
          bVar3 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,BLOCK_MISSING_PREV
                             ,&msg,&local_98);
        }
        else {
          if ((*(byte *)((long)iVar4.
                               super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                               ._M_cur + 0x80) & 0x60) == 0) {
            pCVar7 = (CBlockIndex *)
                     ((long)iVar4.
                            super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                            _M_cur + 0x28);
            args_1 = pCVar7;
            bVar3 = ContextualCheckBlockHeader(block,state,&this->m_blockman,this,pCVar7);
            if (bVar3) {
              if ((*(uint *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                   ._M_cur + 0x80) & 0x60) != 0 ||
                  (*(uint *)((long)iVar4.
                                   super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                                   ._M_cur + 0x80) & 7) < 5) {
                p_Var6 = (this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header._M_header.
                         _M_left;
LAB_008b844a:
                if ((_Rb_tree_header *)p_Var6 !=
                    &(this->m_failed_blocks)._M_t._M_impl.super__Rb_tree_header) {
                  pCVar2 = *(CBlockIndex **)(p_Var6 + 1);
                  pCVar5 = CBlockIndex::GetAncestor(pCVar7,pCVar2->nHeight);
                  if (pCVar5 != pCVar2) goto code_r0x008b846f;
                  if ((pCVar2->nStatus & 0x20) == 0) {
                    __assert_fail("failedit->nStatus & BLOCK_FAILED_VALID",
                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                                  ,0x10f0,
                                  "bool ChainstateManager::AcceptBlockHeader(const CBlockHeader &, BlockValidationState &, CBlockIndex **, bool)"
                                 );
                  }
                  while (local_a8 = pCVar7, pCVar7 != pCVar2) {
                    *(byte *)&pCVar7->nStatus = (byte)pCVar7->nStatus | 0x40;
                    std::
                    _Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                    ::_M_insert_unique<CBlockIndex*const&>
                              ((_Rb_tree<CBlockIndex*,CBlockIndex*,std::_Identity<CBlockIndex*>,std::less<CBlockIndex*>,std::allocator<CBlockIndex*>>
                                *)&(this->m_blockman).m_dirty_blockindex,&local_a8);
                    pCVar7 = local_a8->pprev;
                  }
                  bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
                  if (bVar3) {
                    base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
                    base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)this_00);
                    source_file_06._M_str =
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                    ;
                    source_file_06._M_len = 0x5e;
                    logging_function_06._M_str = "AcceptBlockHeader";
                    logging_function_06._M_len = 0x11;
                    LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                              (logging_function_06,source_file_06,0x10f7,VALIDATION,Debug,
                               (ConstevalFormatString<2U>)0xcd238f,&msg,&local_98);
                    std::__cxx11::string::~string((string *)&local_98);
                    std::__cxx11::string::~string((string *)&msg);
                  }
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&msg,"bad-prevblk",&local_99);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_98,"",&local_a9);
                  bVar3 = ValidationState<BlockValidationResult>::Invalid
                                    (&state->super_ValidationState<BlockValidationResult>,
                                     BLOCK_INVALID_PREV,&msg,&local_98);
                  goto LAB_008b8325;
                }
              }
              goto LAB_008b81d7;
            }
            bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
            if (bVar3) {
              base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
              ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                        (&local_98,&state->super_ValidationState<BlockValidationResult>);
              source_file_05._M_str =
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
              ;
              source_file_05._M_len = 0x5e;
              logging_function_05._M_str = "AcceptBlockHeader";
              logging_function_05._M_len = 0x11;
              LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                        (logging_function_05,source_file_05,0x10d2,VALIDATION,Debug,
                         (ConstevalFormatString<3U>)0xcd23c1,(char (*) [18])"AcceptBlockHeader",&msg
                         ,&local_98);
              goto LAB_008b80ab;
            }
            goto LAB_008b80bf;
          }
          bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
          if (bVar3) {
            base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
            base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)this_00);
            source_file_00._M_str =
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
            ;
            source_file_00._M_len = 0x5e;
            logging_function_00._M_str = "AcceptBlockHeader";
            logging_function_00._M_len = 0x11;
            LogPrintFormatInternal<std::__cxx11::string,std::__cxx11::string>
                      (logging_function_00,source_file_00,0x10ce,VALIDATION,Debug,
                       (ConstevalFormatString<2U>)0xcd238f,&msg,&local_98);
            std::__cxx11::string::~string((string *)&local_98);
            std::__cxx11::string::~string((string *)&msg);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&msg,"bad-prevblk",(allocator<char> *)&local_a8);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
          bVar3 = ValidationState<BlockValidationResult>::Invalid
                            (&state->super_ValidationState<BlockValidationResult>,BLOCK_INVALID_PREV
                             ,&msg,&local_98);
        }
LAB_008b8325:
        std::__cxx11::string::~string((string *)&local_98);
        std::__cxx11::string::~string((string *)&msg);
      }
      else {
        bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
        if (bVar3) {
          base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
          ValidationState<BlockValidationResult>::ToString_abi_cxx11_
                    (&local_98,&state->super_ValidationState<BlockValidationResult>);
          source_file_01._M_str =
               "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
          ;
          source_file_01._M_len = 0x5e;
          logging_function_01._M_str = "AcceptBlockHeader";
          logging_function_01._M_len = 0x11;
          LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                    (logging_function_01,source_file_01,0x10c1,VALIDATION,Debug,
                     (ConstevalFormatString<3U>)0xcd232b,(char (*) [18])"AcceptBlockHeader",&msg,
                     &local_98);
LAB_008b80ab:
          std::__cxx11::string::~string((string *)&local_98);
          std::__cxx11::string::~string((string *)&msg);
        }
LAB_008b80bf:
        bVar3 = false;
      }
      goto LAB_008b8386;
    }
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = (CBlockIndex *)
                 ((long)iVar4.super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>
                        ._M_cur + 0x28);
    }
    if ((*(byte *)((long)iVar4.
                         super__Node_iterator_base<std::pair<const_uint256,_CBlockIndex>,_true>.
                         _M_cur + 0x80) & 0x60) != 0) {
      bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
      if (bVar3) {
        base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
        source_file._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file._M_len = 0x5e;
        logging_function._M_str = "AcceptBlockHeader";
        logging_function._M_len = 0x11;
        LogPrintFormatInternal<char[18],std::__cxx11::string>
                  (logging_function,source_file,0x10ba,VALIDATION,Debug,
                   (ConstevalFormatString<2U>)0xcd230b,(char (*) [18])"AcceptBlockHeader",&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"duplicate",(allocator<char> *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_CACHED_INVALID,
                         &msg,&local_98);
      goto LAB_008b8325;
    }
  }
  else {
LAB_008b81d7:
    if (!min_pow_checked) {
      bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
      if (bVar3) {
        base_blob<256u>::ToString_abi_cxx11_(&msg,(base_blob<256u> *)&hash);
        source_file_03._M_str =
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
        ;
        source_file_03._M_len = 0x5e;
        logging_function_03._M_str = "AcceptBlockHeader";
        logging_function_03._M_len = 0x11;
        LogPrintFormatInternal<char[18],std::__cxx11::string>
                  (logging_function_03,source_file_03,0x10fe,VALIDATION,Debug,
                   (ConstevalFormatString<2U>)0xcd2489,(char (*) [18])"AcceptBlockHeader",&msg);
        std::__cxx11::string::~string((string *)&msg);
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&msg,"too-little-chainwork",(allocator<char> *)&local_a8);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"",&local_99);
      bVar3 = ValidationState<BlockValidationResult>::Invalid
                        (&state->super_ValidationState<BlockValidationResult>,BLOCK_HEADER_LOW_WORK,
                         &msg,&local_98);
      goto LAB_008b8325;
    }
    pCVar7 = ::node::BlockManager::AddToBlockIndex(&this->m_blockman,block,&this->m_best_header);
    if (ppindex != (CBlockIndex **)0x0) {
      *ppindex = pCVar7;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_98,(base_blob<256u> *)&hash);
    tinyformat::format<std::__cxx11::string,int>
              (&msg,(tinyformat *)"Saw new header hash=%s height=%d",(char *)&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&pCVar7->nHeight
               ,(int *)args_1);
    std::__cxx11::string::~string((string *)&local_98);
    bVar3 = IsInitialBlockDownload(this);
    if (bVar3) {
      flag = VALIDATION;
      level = Debug;
      bVar3 = ::LogAcceptCategory(VALIDATION,Debug);
      source_line = 0x1112;
      if (bVar3) goto LAB_008b834b;
    }
    else {
      level = Info;
      flag = ALL;
      source_line = 0x1114;
LAB_008b834b:
      source_file_04._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
      ;
      source_file_04._M_len = 0x5e;
      logging_function_04._M_str = "AcceptBlockHeader";
      logging_function_04._M_len = 0x11;
      LogPrintFormatInternal<std::__cxx11::string>
                (logging_function_04,source_file_04,source_line,flag,level,
                 (ConstevalFormatString<1U>)0xe4f3f8,&msg);
    }
    std::__cxx11::string::~string((string *)&msg);
  }
  bVar3 = true;
LAB_008b8386:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar3;
code_r0x008b846f:
  p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
  goto LAB_008b844a;
}

Assistant:

bool ChainstateManager::AcceptBlockHeader(const CBlockHeader& block, BlockValidationState& state, CBlockIndex** ppindex, bool min_pow_checked)
{
    AssertLockHeld(cs_main);

    // Check for duplicate
    uint256 hash = block.GetHash();
    BlockMap::iterator miSelf{m_blockman.m_block_index.find(hash)};
    if (hash != GetConsensus().hashGenesisBlock) {
        if (miSelf != m_blockman.m_block_index.end()) {
            // Block header is already known.
            CBlockIndex* pindex = &(miSelf->second);
            if (ppindex)
                *ppindex = pindex;
            if (pindex->nStatus & BLOCK_FAILED_MASK) {
                LogDebug(BCLog::VALIDATION, "%s: block %s is marked invalid\n", __func__, hash.ToString());
                return state.Invalid(BlockValidationResult::BLOCK_CACHED_INVALID, "duplicate");
            }
            return true;
        }

        if (!CheckBlockHeader(block, state, GetConsensus())) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::CheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        // Get prev block index
        CBlockIndex* pindexPrev = nullptr;
        BlockMap::iterator mi{m_blockman.m_block_index.find(block.hashPrevBlock)};
        if (mi == m_blockman.m_block_index.end()) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block not found: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_MISSING_PREV, "prev-blk-not-found");
        }
        pindexPrev = &((*mi).second);
        if (pindexPrev->nStatus & BLOCK_FAILED_MASK) {
            LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
            return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
        }
        if (!ContextualCheckBlockHeader(block, state, m_blockman, *this, pindexPrev)) {
            LogDebug(BCLog::VALIDATION, "%s: Consensus::ContextualCheckBlockHeader: %s, %s\n", __func__, hash.ToString(), state.ToString());
            return false;
        }

        /* Determine if this block descends from any block which has been found
         * invalid (m_failed_blocks), then mark pindexPrev and any blocks between
         * them as failed. For example:
         *
         *                D3
         *              /
         *      B2 - C2
         *    /         \
         *  A             D2 - E2 - F2
         *    \
         *      B1 - C1 - D1 - E1
         *
         * In the case that we attempted to reorg from E1 to F2, only to find
         * C2 to be invalid, we would mark D2, E2, and F2 as BLOCK_FAILED_CHILD
         * but NOT D3 (it was not in any of our candidate sets at the time).
         *
         * In any case D3 will also be marked as BLOCK_FAILED_CHILD at restart
         * in LoadBlockIndex.
         */
        if (!pindexPrev->IsValid(BLOCK_VALID_SCRIPTS)) {
            // The above does not mean "invalid": it checks if the previous block
            // hasn't been validated up to BLOCK_VALID_SCRIPTS. This is a performance
            // optimization, in the common case of adding a new block to the tip,
            // we don't need to iterate over the failed blocks list.
            for (const CBlockIndex* failedit : m_failed_blocks) {
                if (pindexPrev->GetAncestor(failedit->nHeight) == failedit) {
                    assert(failedit->nStatus & BLOCK_FAILED_VALID);
                    CBlockIndex* invalid_walk = pindexPrev;
                    while (invalid_walk != failedit) {
                        invalid_walk->nStatus |= BLOCK_FAILED_CHILD;
                        m_blockman.m_dirty_blockindex.insert(invalid_walk);
                        invalid_walk = invalid_walk->pprev;
                    }
                    LogDebug(BCLog::VALIDATION, "header %s has prev block invalid: %s\n", hash.ToString(), block.hashPrevBlock.ToString());
                    return state.Invalid(BlockValidationResult::BLOCK_INVALID_PREV, "bad-prevblk");
                }
            }
        }
    }
    if (!min_pow_checked) {
        LogDebug(BCLog::VALIDATION, "%s: not adding new block header %s, missing anti-dos proof-of-work validation\n", __func__, hash.ToString());
        return state.Invalid(BlockValidationResult::BLOCK_HEADER_LOW_WORK, "too-little-chainwork");
    }
    CBlockIndex* pindex{m_blockman.AddToBlockIndex(block, m_best_header)};

    if (ppindex)
        *ppindex = pindex;

    // Since this is the earliest point at which we have determined that a
    // header is both new and valid, log here.
    //
    // These messages are valuable for detecting potential selfish mining behavior;
    // if multiple displacing headers are seen near simultaneously across many
    // nodes in the network, this might be an indication of selfish mining. Having
    // this log by default when not in IBD ensures broad availability of this data
    // in case investigation is merited.
    const auto msg = strprintf(
        "Saw new header hash=%s height=%d", hash.ToString(), pindex->nHeight);

    if (IsInitialBlockDownload()) {
        LogPrintLevel(BCLog::VALIDATION, BCLog::Level::Debug, "%s\n", msg);
    } else {
        LogPrintf("%s\n", msg);
    }

    return true;
}